

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  Result RVar1;
  _Any_data local_d8;
  _Manager_type local_c8;
  BinaryWriterSpec binary_writer_spec;
  
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             &local_d8,module_stream_factory);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&binary_writer_spec,json_stream,(WriteBinarySpecStreamFactory *)&local_d8,
             source_filename,module_filename_noext,options);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript(&binary_writer_spec,script);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec(&binary_writer_spec);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             std::string_view source_filename,
                             std::string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}